

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
* __thiscall
chaiscript::ChaiScript_Basic::
eval<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,ChaiScript_Basic *this,string *t_input,
          Exception_Handler *t_handler,string *t_filename)

{
  Type_Conversions *this_00;
  undefined1 auStack_38 [32];
  
  eval((ChaiScript_Basic *)auStack_38,(string *)this,(Exception_Handler *)t_input,
       (string *)t_handler);
  this_00 = &(this->m_engine).m_conversions;
  auStack_38._24_8_ = Type_Conversions::conversion_saves(this_00);
  auStack_38._16_8_ = this_00;
  boxed_cast<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
            (__return_storage_ptr__,(chaiscript *)auStack_38,(Boxed_Value *)(auStack_38 + 0x10),
             (Type_Conversions_State *)t_handler);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename = "__EVAL__") {
      return m_engine.boxed_cast<T>(eval(t_input, t_handler, t_filename));
    }